

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

void __thiscall pybind11::error_already_set::error_already_set(error_already_set *this)

{
  string asStack_48 [32];
  
  detail::error_string_abi_cxx11_();
  std::runtime_error::runtime_error(&this->super_runtime_error,asStack_48);
  std::__cxx11::string::~string(asStack_48);
  *(undefined ***)this = &PTR__error_already_set_0013baa8;
  (this->type).super_handle.m_ptr = (PyObject *)0x0;
  (this->value).super_handle.m_ptr = (PyObject *)0x0;
  (this->trace).super_handle.m_ptr = (PyObject *)0x0;
  PyErr_Fetch(&this->type,&this->value,&this->trace);
  return;
}

Assistant:

error_already_set() : std::runtime_error(detail::error_string()) {
        PyErr_Fetch(&type.ptr(), &value.ptr(), &trace.ptr());
    }